

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

int luaH_psetstr(Table *t,TString *key,TValue *val)

{
  TValue *slot;
  TValue *val_local;
  TString *key_local;
  Table *t_local;
  
  if (key->shrlen < '\0') {
    slot = Hgetlongstr(t,key);
    t_local._4_4_ = finishnodeset(t,slot,val);
  }
  else {
    t_local._4_4_ = luaH_psetshortstr(t,key,val);
  }
  return t_local._4_4_;
}

Assistant:

int luaH_psetstr (Table *t, TString *key, TValue *val) {
  if (strisshr(key))
    return luaH_psetshortstr(t, key, val);
  else
    return finishnodeset(t, Hgetlongstr(t, key), val);
}